

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O3

void __thiscall pbrt::LightHandle::Preprocess(LightHandle *this,Bounds3f *sceneBounds)

{
  ulong uVar1;
  ushort uVar2;
  Point3<float> *center;
  uint uVar3;
  ulong uVar4;
  Float *radius;
  anon_class_8_1_e43d4cc1 preprocess;
  
  uVar1 = (this->
          super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
          ).bits;
  uVar2 = (ushort)(uVar1 >> 0x30);
  if (uVar1 >> 0x30 < 5) {
    if (uVar2 != 2) {
      return;
    }
  }
  else {
    if (uVar2 - 4 < 3) {
      return;
    }
    uVar3 = uVar2 - 6;
    uVar4 = uVar1 & 0xffffffffffff;
    if (1 < uVar3) {
      center = (Point3<float> *)(uVar4 + 0x13c);
      radius = (Float *)(uVar4 + 0x148);
      if (uVar3 != 2) {
        center = (Point3<float> *)(uVar4 + 0x1f8);
        radius = (Float *)(uVar4 + 0x1d4);
      }
      goto LAB_00353243;
    }
  }
  center = (Point3<float> *)((uVar1 & 0xffffffffffff) + 0xc4);
  radius = (Float *)((uVar1 & 0xffffffffffff) + 0xd0);
LAB_00353243:
  Bounds3<float>::BoundingSphere(sceneBounds,center,radius);
  return;
}

Assistant:

void LightHandle::Preprocess(const Bounds3f &sceneBounds) {
    auto preprocess = [&](auto ptr) { return ptr->Preprocess(sceneBounds); };
    return DispatchCPU(preprocess);
}